

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void sarimax_setParams(sarimax_object obj,double *phi,double *theta,double *PHI,double *THETA)

{
  int local_34;
  int i;
  double *THETA_local;
  double *PHI_local;
  double *theta_local;
  double *phi_local;
  sarimax_object obj_local;
  
  if (phi == (double *)0x0) {
    for (local_34 = 0; local_34 < obj->p; local_34 = local_34 + 1) {
      obj->phi[local_34] = 0.0;
    }
  }
  else {
    for (local_34 = 0; local_34 < obj->p; local_34 = local_34 + 1) {
      obj->phi[local_34] = phi[local_34];
    }
  }
  if (theta == (double *)0x0) {
    for (local_34 = 0; local_34 < obj->q; local_34 = local_34 + 1) {
      obj->theta[local_34] = 0.0;
    }
  }
  else {
    for (local_34 = 0; local_34 < obj->q; local_34 = local_34 + 1) {
      obj->theta[local_34] = theta[local_34];
    }
  }
  if (PHI == (double *)0x0) {
    for (local_34 = 0; local_34 < obj->P; local_34 = local_34 + 1) {
      obj->PHI[local_34] = 0.0;
    }
  }
  else {
    for (local_34 = 0; local_34 < obj->P; local_34 = local_34 + 1) {
      obj->PHI[local_34] = PHI[local_34];
    }
  }
  if (THETA == (double *)0x0) {
    for (local_34 = 0; local_34 < obj->Q; local_34 = local_34 + 1) {
      obj->THETA[local_34] = 0.0;
    }
  }
  else {
    for (local_34 = 0; local_34 < obj->Q; local_34 = local_34 + 1) {
      obj->THETA[local_34] = THETA[local_34];
    }
  }
  obj->start = 1;
  return;
}

Assistant:

void sarimax_setParams(sarimax_object obj, double *phi, double *theta, double *PHI, double *THETA) {
	int i;
	if (phi) {
		for (i = 0; i < obj->p;++i) {
			obj->phi[i] = phi[i];
		}
	} else {
		for (i = 0; i < obj->p;++i) {
			obj->phi[i] = 0.0;
		}
	}

	if (theta) {
		for (i = 0; i < obj->q;++i) {
			obj->theta[i] = theta[i];
		}
	} else {
		for (i = 0; i < obj->q;++i) {
			obj->theta[i] = 0.0;
		}
	}

	if (PHI) {
		for (i = 0; i < obj->P;++i) {
			obj->PHI[i] = PHI[i];
		}
	} else {
		for (i = 0; i < obj->P;++i) {
			obj->PHI[i] = 0.0;
		}
	}

	if (THETA) {
		for (i = 0; i < obj->Q;++i) {
			obj->THETA[i] = THETA[i];
		}
	} else {
		for (i = 0; i < obj->Q;++i) {
			obj->THETA[i] = 0.0;
		}
	}

	obj->start = 1;
}